

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Vacuum(Parse *pParse,Token *pNm)

{
  Vdbe *p;
  int local_28;
  int iDb;
  Vdbe *v;
  Token *pNm_local;
  Parse *pParse_local;
  
  v = (Vdbe *)pNm;
  pNm_local = (Token *)pParse;
  p = sqlite3GetVdbe(pParse);
  if (v == (Vdbe *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = sqlite3TwoPartName((Parse *)pNm_local,(Token *)v,(Token *)v,(Token **)&v);
  }
  if ((p != (Vdbe *)0x0) && ((1 < local_28 || (local_28 == 0)))) {
    sqlite3VdbeAddOp1(p,10,local_28);
    sqlite3VdbeUsesBtree(p,local_28);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Vacuum(Parse *pParse, Token *pNm){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int iDb = pNm ? sqlite3TwoPartName(pParse, pNm, pNm, &pNm) : 0;
  if( v && (iDb>=2 || iDb==0) ){
    sqlite3VdbeAddOp1(v, OP_Vacuum, iDb);
    sqlite3VdbeUsesBtree(v, iDb);
  }
  return;
}